

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaTest.cpp
# Opt level: O3

void __thiscall Arena_ConExcep_Test::TestBody(Arena_ConExcep_Test *this)

{
  bool bVar1;
  long lVar2;
  ostream *poVar3;
  undefined8 *puVar4;
  char *pcVar5;
  long lVar6;
  Arena arena;
  char local_a1;
  AssertHelper local_a0 [2];
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90 [4];
  long *local_70;
  char *local_68;
  long local_60 [3];
  Arena local_48;
  
  memt::Arena::Arena(&local_48);
  local_60[0] = 0;
  local_60[1] = 0;
  local_68 = (char *)0x0;
  local_70 = local_60;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    pcVar5 = local_48._blocks._block._position;
    if ((ulong)((long)local_48._blocks._block._end - (long)local_48._blocks._block._position) < 0x50
       ) {
      memt::Arena::growCapacity(&local_48,0x50);
      pcVar5 = local_48._blocks._block._position;
    }
    local_48._blocks._block._position = pcVar5 + 0x50;
    lVar6 = 0;
    do {
      lVar2 = (anonymous_namespace)::
              _frobby_Helper<(anonymous_namespace)::_frobby_ConExcepHelperTag,4ul>::_count + 1;
      (anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_ConExcepHelperTag,4ul>::
      _count = lVar2;
      *(long *)(pcVar5 + lVar6) = lVar2;
      if (lVar2 == 4) {
        local_a1 = 'T';
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)
                            &(anonymous_namespace)::
                             _frobby_Helper<(anonymous_namespace)::_frobby_ConExcepHelperTag,4ul>::
                             _log_abi_cxx11_,&local_a1,1);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        puVar4 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar4 = *(undefined8 *)(pcVar5 + lVar6);
        __cxa_throw(puVar4,&unsigned_long::typeinfo,0);
      }
      local_a1 = '+';
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)
                          &(anonymous_namespace)::
                           _frobby_Helper<(anonymous_namespace)::_frobby_ConExcepHelperTag,4ul>::
                           _log_abi_cxx11_,&local_a1,1);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      lVar6 = lVar6 + 8;
    } while (lVar6 != 0x50);
  }
  std::__cxx11::string::_M_replace((ulong)&local_70,0,local_68,0x142965);
  testing::Message::Message((Message *)local_90);
  testing::internal::AssertHelper::AssertHelper
            (local_a0,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Macaulay2[P]memtailor/src/test/ArenaTest.cpp"
             ,0xb2,(char *)local_70);
  testing::internal::AssertHelper::operator=(local_a0,(Message *)local_90);
  testing::internal::AssertHelper::~AssertHelper(local_a0);
  if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_90[0]._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_90[0]._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl + 8))();
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  memt::Arena::~Arena(&local_48);
  return;
}

Assistant:

TEST(Arena, ConExcep) {
  memt::Arena arena;
  ASSERT_THROW(arena.allocArray<ConExcepHelper>(10), size_t);
  ASSERT_EQ(ConExcepHelper::resetLog(), "+1+2+3T4-3-2-1");
  ASSERT_TRUE(arena.isEmpty());
}